

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O3

void toggle_draw_update(t_toggle *x,_glist *glist)

{
  int iVar1;
  undefined4 extraout_var;
  _glist *p_Var2;
  char tag [128];
  char local_b8 [136];
  
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    p_Var2 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar1));
    iVar1 = (&(x->x_gui).x_fcol)[-(uint)(x->x_on == 0.0) & 1];
    sprintf(local_b8,"%lxX1",x);
    pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-fill",iVar1);
    sprintf(local_b8,"%lxX2",x);
    pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_b8,"-fill",iVar1);
  }
  return;
}

Assistant:

void toggle_draw_update(t_toggle *x, t_glist *glist)
{
    if(glist_isvisible(glist))
    {
        t_canvas *canvas = glist_getcanvas(glist);
        int col = (x->x_on != 0.0) ? x->x_gui.x_fcol : x->x_gui.x_bcol;
        char tag[128];

        sprintf(tag, "%lxX1", x);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", col);
        sprintf(tag, "%lxX2", x);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", col);
    }
}